

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QXmlStreamPrivateTagStack::NamespaceDeclaration>::copyAppend
          (QGenericArrayOps<QXmlStreamPrivateTagStack::NamespaceDeclaration> *this,
          NamespaceDeclaration *b,NamespaceDeclaration *e)

{
  NamespaceDeclaration *pNVar1;
  void *in_RDX;
  void *in_RSI;
  long in_RDI;
  NamespaceDeclaration *data;
  void *local_10;
  
  if (in_RSI != in_RDX) {
    pNVar1 = QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration>::begin
                       ((QArrayDataPointer<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)
                        0x667cf7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      memcpy(pNVar1 + *(long *)(in_RDI + 0x10),local_10,0x30);
      local_10 = (void *)((long)local_10 + 0x30);
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }